

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.cpp
# Opt level: O1

void __thiscall argparse::args_t::args_t(args_t *this,int argc,char **argv)

{
  char cVar1;
  char *str;
  int iVar2;
  FILE *pFVar3;
  char *__s1;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  
  this->output = (FILE *)_stdout;
  this->input1 = _stdin;
  this->input2 = (FILE *)0x0;
  this->distance = 0.015;
  this->min_distance = -1e-10;
  this->ambig = resolve;
  this->format = csv;
  this->overlap = 100;
  this->do_bootstrap = false;
  this->do_bootstrap_two_files = false;
  this->do_count = false;
  this->quiet = false;
  this->quiet = false;
  this->do_fst = false;
  this->skip_header = false;
  this->report_self = false;
  this->counts_in_name = ':';
  this->include_prob = 1.0;
  this->ambigs_to_resolve = (char *)0x0;
  this->resolve_fraction = 1.0;
  this->delimiter = ',';
  if (1 < argc) {
    iVar6 = 1;
    do {
      str = argv[iVar6];
      if (*str != '-') {
        if (iVar6 == argc + -1) {
          parse_input(this,str);
        }
        else {
          ERROR("unknown argument: %s",str);
        }
        goto LAB_0010922d;
      }
      if (str[1] == '-') {
        pcVar5 = str + 2;
        __s1 = "help";
        pcVar4 = pcVar5;
        iVar2 = strcmp(pcVar5,"help");
        if (iVar2 == 0) {
          argparse::args_t();
        }
        else {
          __s1 = "version";
          iVar2 = strcmp(pcVar5,"version");
          pcVar4 = pcVar5;
          if (iVar2 != 0) {
            ERROR("unknown argument: %s",str);
            goto LAB_0010922d;
          }
        }
        argparse::args_t();
LAB_0010959d:
        argparse::args_t();
switchD_001091f7_caseD_76:
        argparse::args_t();
        pFVar3 = _stdout;
        if ((__s1 != (char *)0x0) && (iVar6 = strcmp(__s1,"-"), pFVar3 = _stdout, iVar6 != 0)) {
          pFVar3 = fopen(__s1,"wb");
        }
        *(FILE **)pcVar4 = pFVar3;
        if (pFVar3 != (FILE *)0x0) {
          return;
        }
        ERROR("failed to open the OUTPUT file %s",__s1);
        return;
      }
      pcVar5 = str + 1;
      __s1 = "h";
      pcVar4 = pcVar5;
      iVar2 = strcmp(pcVar5,"h");
      if (iVar2 == 0) goto LAB_0010959d;
      cVar1 = *pcVar5;
      switch(cVar1) {
      case 'a':
        iVar6 = iVar6 + 1;
        if (iVar6 == argc) {
          ERROR("ran out of command line arguments");
        }
        parse_ambig(this,argv[iVar6]);
        break;
      case 'b':
        this->do_bootstrap = true;
        break;
      case 'c':
        this->do_count = true;
        break;
      case 'd':
        iVar6 = iVar6 + 1;
        if (iVar6 == argc) {
          ERROR("ran out of command line arguments");
        }
        parse_counts_in_name(this,argv[iVar6]);
        break;
      case 'e':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
      case 'p':
switchD_001091f7_caseD_65:
        ERROR("unknown argument: %s",str);
        break;
      case 'f':
        iVar6 = iVar6 + 1;
        if (iVar6 == argc) {
          ERROR("ran out of command line arguments");
        }
        parse_format(this,argv[iVar6]);
        break;
      case 'g':
        iVar6 = iVar6 + 1;
        if (iVar6 == argc) {
          ERROR("ran out of command line arguments");
        }
        parse_fraction(this,argv[iVar6]);
        break;
      case 'l':
        iVar6 = iVar6 + 1;
        if (iVar6 == argc) {
          ERROR("ran out of command line arguments");
        }
        parse_overlap(this,argv[iVar6]);
        break;
      case 'm':
        this->do_fst = true;
        break;
      case 'n':
        this->skip_header = true;
        break;
      case 'o':
        iVar6 = iVar6 + 1;
        if (iVar6 == argc) {
          ERROR("ran out of command line arguments");
        }
        parse_output(this,argv[iVar6]);
        break;
      case 'q':
        this->quiet = true;
        break;
      case 'r':
        this->do_bootstrap_two_files = true;
        break;
      case 's':
        iVar6 = iVar6 + 1;
        if (iVar6 == argc) {
          ERROR("ran out of command line arguments");
        }
        parse_second_in(this,argv[iVar6]);
        break;
      case 't':
        iVar6 = iVar6 + 1;
        if (iVar6 == argc) {
          ERROR("ran out of command line arguments");
        }
        parse_distance(this,argv[iVar6]);
        break;
      case 'u':
        iVar6 = iVar6 + 1;
        if (iVar6 == argc) {
          ERROR("ran out of command line arguments");
        }
        parse_include_prob(this,argv[iVar6]);
        break;
      case 'v':
        goto switchD_001091f7_caseD_76;
      case 'w':
        iVar6 = iVar6 + 1;
        if (iVar6 == argc) {
          ERROR("ran out of command line arguments");
        }
        parse_min_distance(this,argv[iVar6]);
        break;
      default:
        if (cVar1 == '0') {
          this->report_self = true;
        }
        else {
          if (cVar1 != 'D') goto switchD_001091f7_caseD_65;
          iVar6 = iVar6 + 1;
          if (iVar6 == argc) {
            ERROR("ran out of command line arguments");
          }
          parse_delimiter(this,argv[iVar6]);
        }
      }
LAB_0010922d:
      iVar6 = iVar6 + 1;
    } while (iVar6 < argc);
  }
  return;
}

Assistant:

args_t::args_t( int argc, const char * argv[] ) :
  output( stdout ),
  input1( stdin ),
  input2( NULL ),
  distance( DEFAULT_DISTANCE ),
  min_distance( DEFAULT_MIN_DISTANCE ),
  ambig( DEFAULT_AMBIG ),
  format ( DEFAULT_FORMAT ),
  overlap ( DEFAULT_OVERLAP ),
  do_bootstrap( false ),
  do_bootstrap_two_files ( false ),
  do_count( false ),
  quiet( false ),
  do_fst( false ),
  skip_header ( false ),
  report_self ( false ),
  counts_in_name ( DEFAULT_COUNTS_IN_NAME ),
  include_prob( DEFAULT_INCLUDE_PROB ),
  ambigs_to_resolve(NULL),
  resolve_fraction(DEFAULT_FRACTION),
  delimiter (DEFAULT_DELIMITER)
  {
      // skip arg[0], it's just the program name
    for (int i = 1; i < argc; ++i ) {
      const char * arg = argv[i];
      
      if ( arg[0] == '-' && arg[1] == '-' ) {
        if ( !strcmp( &arg[2], "help" ) ) help();
        else if ( !strcmp( &arg[2], "version" ) ) version();
        else
          ERROR( "unknown argument: %s", arg );
      }
      else if ( arg[0] == '-' ) {
        if ( !strcmp( &arg[1], "h" ) ) help();
        else if (  arg[1] == 'v' ) version();
        else if (  arg[1] == 'o' ) parse_output( next_arg (i, argc, argv) );
        else if (  arg[1] == 't' ) parse_distance ( next_arg (i, argc, argv) );
        else if (  arg[1] == 'w' ) parse_min_distance ( next_arg (i, argc, argv) );
        else if (  arg[1] == 'l')  parse_overlap( next_arg (i, argc, argv) );
        else if (  arg[1] == 'f')  parse_format( next_arg (i, argc, argv) );
        else if (  arg[1] == 'a')  parse_ambig( next_arg (i, argc, argv) );
        else if (  arg[1] == 's')  parse_second_in( next_arg (i, argc, argv) );
        else if (  arg[1] == 'd')  parse_counts_in_name( next_arg (i, argc, argv) );
        else if (  arg[1] == 'u')  parse_include_prob( next_arg (i, argc, argv) );
        else if (  arg[1] == 'D')  parse_delimiter ( next_arg (i, argc, argv) );
        else if (  arg[1] == 'b')  parse_bootstrap();
        else if (  arg[1] == 'r')  parse_bootstrap_two_files ();
        else if (  arg[1] == 'c')  parse_count();
        else if (  arg[1] == 'n')  parse_no_header ();
        else if (  arg[1] == 'q')  parse_quiet();
        else if (  arg[1] == 'm')  parse_fst();
        else if (  arg[1] == '0')  parse_report_self();
        else if (  arg[1] == 'g')  parse_fraction( next_arg (i, argc, argv) );
        else
          ERROR( "unknown argument: %s", arg );
      }
      else
        if (i == argc-1) {
          parse_input (arg);
        } else {
          ERROR( "unknown argument: %s", arg );
        }
    }
  }